

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O0

void Am_Animator_Animation_proc(Am_Object *interp,Am_Time *elapsed_time)

{
  bool bVar1;
  Am_Wrapper *value;
  Am_Value *pAVar2;
  float fVar3;
  Am_Object local_e0;
  Am_Object local_d8;
  undefined1 local_d0 [8];
  Am_Object_Method method;
  Am_Time duration;
  Am_Value local_a8;
  Am_Object local_98;
  undefined1 local_90 [8];
  Am_Value curr_value;
  Am_Path_Function path;
  Am_Value value2;
  Am_Value value1;
  Am_Time local_40;
  Am_Object local_38;
  float local_2c;
  undefined1 local_28 [4];
  float tau;
  Am_Timing_Function timing;
  Am_Time *elapsed_time_local;
  Am_Object *interp_local;
  
  timing.Call = (Am_Timing_Function_Type *)elapsed_time;
  value = Am_Time::operator_cast_to_Am_Wrapper_(elapsed_time);
  Am_Object::Set(interp,0xea,value,0);
  pAVar2 = Am_Object::Get(interp,0x102,0);
  Am_Timing_Function::Am_Timing_Function((Am_Timing_Function *)local_28,pAVar2);
  Am_Object::Am_Object(&local_38,interp);
  Am_Time::Am_Time(&local_40,(Am_Time *)timing.Call);
  fVar3 = (float)(*(code *)timing.from_wrapper)(&local_38,&local_40);
  Am_Time::~Am_Time(&local_40);
  Am_Object::~Am_Object(&local_38);
  local_2c = fVar3;
  Am_Value::Am_Value((Am_Value *)&value2.value);
  Am_Value::Am_Value((Am_Value *)&path.Call);
  pAVar2 = Am_Object::Peek(interp,0x181,0);
  Am_Value::operator=((Am_Value *)&value2.value,pAVar2);
  pAVar2 = Am_Object::Peek(interp,0x182,0);
  Am_Value::operator=((Am_Value *)&path.Call,pAVar2);
  pAVar2 = Am_Object::Get(interp,0x103,0);
  Am_Path_Function::Am_Path_Function((Am_Path_Function *)&curr_value.value,pAVar2);
  Am_Object::Am_Object(&local_98,interp);
  Am_Value::Am_Value(&local_a8,(Am_Value *)&value2.value);
  Am_Value::Am_Value((Am_Value *)&duration,(Am_Value *)&path.Call);
  (*(code *)path.from_wrapper)(local_2c,local_90,&local_98,&local_a8,&duration);
  Am_Value::~Am_Value((Am_Value *)&duration);
  Am_Value::~Am_Value(&local_a8);
  Am_Object::~Am_Object(&local_98);
  Am_Object::Set(interp,0x169,(Am_Value *)local_90,0);
  pAVar2 = Am_Object::Get(interp,0xff,0);
  Am_Time::Am_Time((Am_Time *)&method.Call,pAVar2);
  if ((1.0 <= local_2c) && (bVar1 = Am_Time::Zero((Am_Time *)timing.Call), !bVar1)) {
    Am_Object::Set(interp,0x169,(Am_Value *)&path.Call,0);
    pAVar2 = Am_Object::Get(interp,200,0);
    Am_Object_Method::Am_Object_Method((Am_Object_Method *)local_d0,pAVar2);
    bVar1 = Am_Object_Method::Valid((Am_Object_Method *)local_d0);
    if (bVar1) {
      Am_Object::Am_Object(&local_d8,interp);
      (*(code *)method.from_wrapper)(&local_d8);
      Am_Object::~Am_Object(&local_d8);
    }
  }
  Am_Object::Am_Object(&local_e0,interp);
  Am_Set_Animated_Slots(&local_e0);
  Am_Object::~Am_Object(&local_e0);
  Am_Time::~Am_Time((Am_Time *)&method.Call);
  Am_Value::~Am_Value((Am_Value *)local_90);
  Am_Value::~Am_Value((Am_Value *)&path.Call);
  Am_Value::~Am_Value((Am_Value *)&value2.value);
  return;
}

Assistant:

Am_Define_Method(Am_Timer_Method, void, Am_Animator_Animation,
                 (Am_Object interp, const Am_Time &elapsed_time))
{
  interp.Set(Am_ELAPSED_TIME, elapsed_time);

  //
  // INTERPOLATING
  //

  // tau is the current position along the parameterized path,
  // measured as a fraction of the distance along total path.
  // (The path may be abstract;  for instance, if the path is just a list
  // of values, tau = 0.5 would mean halfway down the list.)
  //
  // The timing function maps elapsed_time (true time) into tau (path time).
  Am_Timing_Function timing = interp.Get(Am_TIMING_FUNCTION);
  float tau = timing.Call(interp, elapsed_time);

  // The path function maps tau into an actual position on the path.
  Am_Value value1, value2;
  value1 = interp.Peek(Am_VALUE_1);
  value2 = interp.Peek(Am_VALUE_2);
  Am_Path_Function path = interp.Get(Am_PATH_FUNCTION);
  Am_Value curr_value = path.Call(interp, value1, value2, tau);
  interp.Set(Am_VALUE, curr_value);

  Am_Time duration = interp.Get(Am_CURRENT_DURATION);
  Am_INTER_TRACE_PRINT(interp, "Animator Animation of "
                                   << interp << ", time=" << elapsed_time
                                   << ", duration=" << duration
                                   << ", val=" << interp.Get(Am_VALUE));

  if (tau >= 1.0 && !elapsed_time.Zero()) {
    // call INTERIM_DO to get next segment of path (if any)
    interp.Set(Am_VALUE, value2);

    Am_Object_Method method = interp.Get(Am_INTERIM_DO_METHOD);
    if (method.Valid())
      method.Call(interp);
  }

  Am_Set_Animated_Slots(interp);
}